

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O3

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this)

{
  qint64 *pqVar1;
  QDecompressHelper *this_00;
  qsizetype qVar2;
  ssize_t sVar3;
  size_t in_RCX;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  array<char,_1024UL> temp;
  QByteArray local_438 [42];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    bVar5 = (this->compressedDataBuffer).bufferCompleteSize != 0;
    bVar4 = bVar5 | this->decoderHasData;
    if (!bVar5 && (this->decoderHasData & 1U) == 0) break;
    if (this->MaxDecompressedDataBufferSize <= (this->decompressedDataBuffer).bufferCompleteSize)
    goto LAB_001e3e23;
    local_438[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_438[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_438[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(local_438,0x40000,Uninitialized);
    if ((&(local_438[0].d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_438[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)local_438,(AllocationOption)local_438[0].d.size);
    }
    qVar2 = readInternal(this,local_438[0].d.ptr,local_438[0].d.size);
    if ((qVar2 != -1) &&
       (QByteArray::truncate((longlong)local_438),
       (undefined1 *)local_438[0].d.size != (undefined1 *)0x0)) {
      pqVar1 = &(this->decompressedDataBuffer).bufferCompleteSize;
      *pqVar1 = (qint64)(local_438[0].d.size + *pqVar1);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)&this->decompressedDataBuffer,
                 (this->decompressedDataBuffer).buffers.d.size,local_438);
      QList<QByteArray>::end(&(this->decompressedDataBuffer).buffers);
    }
    if (&(local_438[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_438[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_438[0].d.d)->super_QArrayData,1,0x10);
      }
    }
  } while (qVar2 != -1);
  goto LAB_001e3e6d;
  while( true ) {
    memset(local_438,0xaa,0x400);
    sVar3 = read(this_00,(int)local_438,(void *)0x400,in_RCX);
    if (sVar3 == -1) break;
LAB_001e3e23:
    this_00 = (this->countHelper)._M_t.
              super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t
              .super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
              super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    bVar5 = (this_00->compressedDataBuffer).bufferCompleteSize != 0;
    bVar6 = (this_00->decompressedDataBuffer).bufferCompleteSize != 0;
    bVar4 = bVar6 | bVar5 | this_00->decoderHasData;
    if (!bVar6 && (!bVar5 && (this_00->decoderHasData & 1U) == 0)) break;
  }
LAB_001e3e6d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)((bVar4 ^ 1) & 1);
}

Assistant:

bool QDecompressHelper::countInternal()
{
    Q_ASSERT(countDecompressed);
    while (hasDataInternal()
           && decompressedDataBuffer.byteAmount() < MaxDecompressedDataBufferSize) {
        const qsizetype toRead = 256 * 1024;
        QByteArray buffer(toRead, Qt::Uninitialized);
        qsizetype bytesRead = readInternal(buffer.data(), buffer.size());
        if (bytesRead == -1)
            return false;
        buffer.truncate(bytesRead);
        decompressedDataBuffer.append(std::move(buffer));
    }
    if (!hasDataInternal())
        return true; // handled all the data so far, just return

    while (countHelper->hasData()) {
        std::array<char, 1024> temp;
        qsizetype bytesRead = countHelper->read(temp.data(), temp.size());
        if (bytesRead == -1)
            return false;
    }
    return true;
}